

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fchmod_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req->fs_type == UV_FS_FCHMOD) {
    if (req->result == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      uv_fs_req_cleanup(req);
      check_permission("test_file",*req->data);
      return;
    }
    pcVar2 = "req->result == 0";
    uVar1 = 0x103;
  }
  else {
    pcVar2 = "req->fs_type == UV_FS_FCHMOD";
    uVar1 = 0x102;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void fchmod_cb(uv_fs_t* req) {
  ASSERT(req->fs_type == UV_FS_FCHMOD);
  ASSERT(req->result == 0);
  fchmod_cb_count++;
  uv_fs_req_cleanup(req);
  check_permission("test_file", *(int*)req->data);
}